

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
          (void *param_1,short_string_storage *param_2)

{
  long_string_storage *other;
  short_string_storage *this;
  long_string_storage temp;
  short_string_storage *args;
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  long_string_storage local_28;
  short_string_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  other = cast<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                    (in_stack_ffffffffffffffc0);
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_>::long_string_storage
  ::long_string_storage(&local_28,other);
  args = local_18;
  this = cast<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage&>
            ((basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             args);
  construct<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage&>
            ((basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (long_string_storage *)args);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }